

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

precise_unit units::checkForCustomUnit(string *unit_string)

{
  char *pcVar1;
  string *psVar2;
  long *plVar3;
  ushort uVar4;
  int iVar5;
  uint32_t uVar6;
  unit_data uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  string *psVar11;
  bool bVar12;
  precise_unit pVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> csub;
  long *local_70;
  string *local_68;
  long local_60 [2];
  double local_50;
  string local_48;
  
  uVar9 = 0xfa94a488;
  pcVar1 = (unit_string->_M_dataplus)._M_p;
  local_50 = NAN;
  if (*pcVar1 == '{') {
    if (pcVar1[unit_string->_M_string_length - 1] != '}') goto LAB_0017eb0e;
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"\'u}","");
    psVar2 = (string *)unit_string->_M_string_length;
    uVar10 = (long)psVar2 - (long)local_68;
    if (psVar2 < local_68 || uVar10 == 0) {
      bVar12 = false;
    }
    else {
      iVar5 = std::__cxx11::string::compare((ulong)unit_string,uVar10,local_68);
      bVar12 = iVar5 == 0;
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if (bVar12) {
      lVar8 = -3;
      goto LAB_0017e960;
    }
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"index}","");
    psVar2 = (string *)unit_string->_M_string_length;
    uVar10 = (long)psVar2 - (long)local_68;
    if (local_68 <= psVar2 && uVar10 != 0) {
      iVar5 = std::__cxx11::string::compare((ulong)unit_string,uVar10,local_68);
      goto LAB_0017e9d3;
    }
LAB_0017e9db:
    bVar12 = false;
LAB_0017e9dd:
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if (!bVar12) goto LAB_0017eb0e;
    bVar12 = true;
    lVar8 = -6;
  }
  else {
    if ((*pcVar1 != '[') || (pcVar1[unit_string->_M_string_length - 1] != ']')) goto LAB_0017eb0e;
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"U]","");
    psVar2 = (string *)unit_string->_M_string_length;
    uVar10 = (long)psVar2 - (long)local_68;
    if (psVar2 < local_68 || uVar10 == 0) {
      bVar12 = false;
    }
    else {
      iVar5 = std::__cxx11::string::compare((ulong)unit_string,uVar10,local_68);
      bVar12 = iVar5 == 0;
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    if (!bVar12) {
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"index]","");
      psVar2 = (string *)unit_string->_M_string_length;
      uVar10 = (long)psVar2 - (long)local_68;
      if (psVar2 < local_68 || uVar10 == 0) goto LAB_0017e9db;
      iVar5 = std::__cxx11::string::compare((ulong)unit_string,uVar10,local_68);
LAB_0017e9d3:
      bVar12 = iVar5 == 0;
      goto LAB_0017e9dd;
    }
    lVar8 = -2;
LAB_0017e960:
    bVar12 = false;
  }
  if (lVar8 + unit_string->_M_string_length != -1) {
    std::__cxx11::string::substr((ulong)&local_70,(ulong)unit_string);
    psVar2 = local_68;
    plVar3 = local_70;
    if (bVar12) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_48,local_70,local_68 + (long)local_70);
      uVar6 = getCommodity(&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      uVar9 = (ulong)uVar6 << 0x20 | 0x51800;
    }
    else {
      if (local_68 == (string *)0x0) {
        local_68 = (string *)0x0;
      }
      else {
        psVar11 = (string *)0x0;
        do {
          iVar5 = tolower((int)(char)*(string *)((long)plVar3 + (long)psVar11));
          *(string *)((long)plVar3 + (long)psVar11) = SUB41(iVar5,0);
          psVar11 = psVar11 + 1;
        } while (psVar2 != psVar11);
      }
      uVar4 = std::_Hash_bytes(local_70,(ulong)local_68,0xc70f6907);
      uVar7 = precise::custom::custom_unit(uVar4 & 0x3f);
      uVar9 = (ulong)(uint)uVar7;
    }
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    local_50 = 1.0;
  }
LAB_0017eb0e:
  pVar13.base_units_ = (unit_data)(int)uVar9;
  pVar13.commodity_ = (int)(uVar9 >> 0x20);
  pVar13.multiplier_ = local_50;
  return pVar13;
}

Assistant:

static precise_unit checkForCustomUnit(const std::string& unit_string)
{
    size_t loc = std::string::npos;
    bool index = false;
    if (unit_string.front() == '[' && unit_string.back() == ']') {
        if (ends_with(unit_string, "U]")) {
            loc = unit_string.size() - 2;
        } else if (ends_with(unit_string, "index]")) {
            loc = unit_string.size() - 6;
            index = true;
        }
    } else if (unit_string.front() == '{' && unit_string.back() == '}') {
        if (ends_with(unit_string, "'u}")) {
            loc = unit_string.size() - 3;
        } else if (ends_with(unit_string, "index}")) {
            loc = unit_string.size() - 6;
            index = true;
        }
    }
    if (loc != std::string::npos) {
        if ((unit_string[loc - 1] == '\'') || (unit_string[loc - 1] == '_')) {
            --loc;
        }
        auto csub = unit_string.substr(1, loc - 1);

        if (index) {
            auto hcode = getCommodity(csub);
            return {1.0, precise::generate_custom_count_unit(0), hcode};
        }

        std::transform(csub.begin(), csub.end(), csub.begin(), ::tolower);
        auto custcode = std::hash<std::string>{}(csub);
        return precise::generate_custom_unit(custcode & 0x3FU);
    }

    return precise::invalid;
}